

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::FreeMatrix(Codec *this)

{
  void *in_RDI;
  
  if (*(long *)((long)in_RDI + 0x90) != 0) {
    SIMDSafeFree(in_RDI);
    *(undefined8 *)((long)in_RDI + 0x90) = 0;
  }
  *(undefined8 *)((long)in_RDI + 0xa0) = 0;
  return;
}

Assistant:

void Codec::FreeMatrix()
{
    // If memory was allocated:
    if (_compress_matrix != nullptr)
    {
        // Free it now
        SIMDSafeFree(_compress_matrix);
        _compress_matrix = nullptr;
    }

    _ge_allocated = 0;
}